

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.c
# Opt level: O3

void fill_with_pseudorandom_data(void *buffer,size_t size)

{
  FILE *__stream;
  int iVar1;
  char *__nptr;
  int *piVar2;
  ulonglong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong __n;
  ulong uVar6;
  size_t __n_00;
  void *pvVar7;
  
  __nptr = getenv("TEST_RANDOM_SEED");
  if (__nptr != (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    uVar3 = strtoull(__nptr,(char **)0x0,10);
    __stream = _stderr;
    if (*piVar2 == 0) goto LAB_00115544;
    strerror(*piVar2);
    fprintf(__stream,"strtoull(%s) failed: %s",__nptr);
  }
  iVar1 = rand();
  uVar3 = (ulonglong)iVar1;
LAB_00115544:
  uVar4 = (ulong)buffer & 7;
  if (uVar4 == 0) {
    __n_00 = 0;
    pvVar7 = buffer;
  }
  else {
    __n_00 = 8 - uVar4;
    memset(buffer,0xab,__n_00);
    pvVar7 = (void *)((long)buffer + (8 - uVar4));
  }
  if (((ulong)pvVar7 & 7) != 0) {
    __assert_fail("(uintptr_t)aligned_buffer % sizeof(uint64_t) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_utils.c"
                  ,0x4d,"void fill_with_pseudorandom_data_seed(uint64_t, void *, size_t)");
  }
  uVar4 = size - __n_00;
  __n = (ulong)((uint)uVar4 & 7);
  if (7 < uVar4) {
    uVar5 = 0;
    do {
      uVar6 = uVar3 << 0xd ^ uVar3;
      uVar6 = uVar6 >> 7 ^ uVar6;
      uVar3 = uVar6 << 0x11 ^ uVar6;
      *(ulonglong *)((long)pvVar7 + uVar5 * 8) = uVar3;
      uVar5 = uVar5 + 1;
    } while (uVar4 >> 3 != uVar5);
  }
  if (__n == 0) {
    return;
  }
  memset((void *)((long)buffer + (size - __n)),0xcd,__n);
  return;
}

Assistant:

void
fill_with_pseudorandom_data(void *buffer, size_t size)
{
	uint64_t seed;
	const char* seed_str;
	/*
	 * Check if a seed has been specified in the environment, otherwise fall
	 * back to using rand() as a seed.
	 */
	if ((seed_str = getenv("TEST_RANDOM_SEED")) != NULL) {
		errno = 0;
		seed = strtoull(seed_str, NULL, 10);
		if (errno != 0) {
			fprintf(stderr, "strtoull(%s) failed: %s", seed_str,
			    strerror(errno));
			seed = rand();
		}
	} else {
		seed = rand();
	}
	fill_with_pseudorandom_data_seed(seed, buffer, size);
}